

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::ColumnIndex::ColumnIndex(ColumnIndex *this,ColumnIndex *other211)

{
  long in_RSI;
  TBase *in_RDI;
  vector<bool,_true> *pvVar1;
  vector<bool,_true> *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__ColumnIndex_00c02388;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__ColumnIndex_00c02388;
  pvVar1 = (vector<bool,_true> *)(in_RDI + 1);
  duckdb::vector<bool,_true>::vector((vector<bool,_true> *)0x71ada0);
  this_00 = (vector<bool,_true> *)(in_RDI + 6);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x71adb3);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x71adc6);
  duckdb::vector<long,_true>::vector((vector<long,_true> *)0x71add9);
  duckdb::vector<long,_true>::vector((vector<long,_true> *)0x71adec);
  duckdb::vector<long,_true>::vector((vector<long,_true> *)0x71ae02);
  _ColumnIndex__isset::_ColumnIndex__isset((_ColumnIndex__isset *)(in_RDI + 0x16));
  duckdb::vector<bool,_true>::operator=(this_00,pvVar1);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)this_00,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)pvVar1);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)this_00,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)pvVar1);
  *(undefined4 *)&in_RDI[0xc]._vptr_TBase = *(undefined4 *)(in_RSI + 0x60);
  duckdb::vector<long,_true>::operator=((vector<long,_true> *)this_00,(vector<long,_true> *)pvVar1);
  duckdb::vector<long,_true>::operator=((vector<long,_true> *)this_00,(vector<long,_true> *)pvVar1);
  duckdb::vector<long,_true>::operator=((vector<long,_true> *)this_00,(vector<long,_true> *)pvVar1);
  *(undefined1 *)&in_RDI[0x16]._vptr_TBase = *(undefined1 *)(in_RSI + 0xb0);
  return;
}

Assistant:

ColumnIndex::ColumnIndex(const ColumnIndex& other211) {
  null_pages = other211.null_pages;
  min_values = other211.min_values;
  max_values = other211.max_values;
  boundary_order = other211.boundary_order;
  null_counts = other211.null_counts;
  repetition_level_histograms = other211.repetition_level_histograms;
  definition_level_histograms = other211.definition_level_histograms;
  __isset = other211.__isset;
}